

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Node<QByteArray,QPalette>::emplaceValue<QPalette_const&>
          (Node<QByteArray,_QPalette> *this,QPalette *args)

{
  QPalette *in_RSI;
  QPalette *in_RDI;
  long in_FS_OFFSET;
  QPalette *this_00;
  QPalette local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &local_18;
  QPalette::QPalette(this_00,in_RSI);
  QPalette::operator=(this_00,in_RDI);
  QPalette::~QPalette(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }